

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O0

void embree::storeTga(Ref<embree::Image> *img,FileName *fileName)

{
  undefined8 uVar1;
  char *pcVar2;
  long *in_RDI;
  Color c;
  size_t x;
  size_t y;
  fstream file;
  fstream *in_stack_fffffffffffffbf8;
  float in_stack_fffffffffffffc04;
  uchar v;
  float local_3f8;
  float local_3f4;
  float local_3dc;
  float local_3c4;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 auStack_330 [2];
  ulong local_320;
  ulong local_318;
  long local_300 [67];
  long *local_e8;
  long *local_e0;
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined8 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  long local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 local_30;
  float local_2c;
  undefined4 local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_e8 = in_RDI;
  std::fstream::fstream(local_300);
  uVar1 = *(undefined8 *)(local_300[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_300 + (int)uVar1);
  pcVar2 = FileName::c_str((FileName *)0x476a1b);
  std::operator|(_S_out,_S_bin);
  std::fstream::open((char *)local_300,(_Ios_Openmode)pcVar2);
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  local_c0 = local_e8;
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  local_c8 = local_e8;
  fwrite_ushort((unsigned_short)((uint)in_stack_fffffffffffffc04 >> 0x10),in_stack_fffffffffffffbf8)
  ;
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  fwrite_uchar((uchar)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffbf8);
  local_3f8 = in_stack_fffffffffffffc04;
  for (local_318 = 0; local_d0 = local_e8, local_318 < *(ulong *)(*local_e8 + 0x18);
      local_318 = local_318 + 1) {
    local_320 = 0;
    while( true ) {
      v = (uchar)((uint)local_3f8 >> 0x18);
      local_d8 = local_e8;
      if (*(ulong *)(*local_e8 + 0x10) <= local_320) break;
      local_e0 = local_e8;
      (**(code **)(*(long *)*local_e8 + 0x20))(&local_348,(long *)*local_e8,local_320,local_318);
      local_b0 = &local_338;
      local_b8 = &local_348;
      local_338 = local_348;
      auStack_330[0] = uStack_340;
      uVar1 = auStack_330[0];
      local_68 = auStack_330;
      local_50 = &zero;
      local_34c = 0;
      local_38 = &one;
      local_350 = 0x3f800000;
      local_70 = &local_34c;
      local_78 = &local_350;
      auStack_330[0]._0_4_ = (float)uStack_340;
      local_14 = (float)auStack_330[0];
      local_18 = 1.0;
      local_3c4 = local_18;
      if ((float)auStack_330[0] < 1.0) {
        local_3c4 = local_14;
      }
      local_30 = 0;
      local_2c = local_3c4;
      auStack_330[0] = uVar1;
      fwrite_uchar(v,in_stack_fffffffffffffbf8);
      local_80 = (long)&local_338 + 4;
      local_58 = &zero;
      local_354 = 0;
      local_40 = &one;
      local_358 = 0x3f800000;
      local_88 = &local_354;
      local_90 = &local_358;
      local_c = local_338._4_4_;
      local_10 = 1.0;
      local_3dc = local_10;
      if (local_338._4_4_ < 1.0) {
        local_3dc = local_c;
      }
      local_28 = 0;
      local_24 = local_3dc;
      fwrite_uchar(v,in_stack_fffffffffffffbf8);
      local_98 = &local_338;
      local_60 = &zero;
      local_35c = 0;
      local_48 = &one;
      local_360 = 0x3f800000;
      local_a0 = &local_35c;
      local_a8 = &local_360;
      local_4 = (float)local_338;
      local_8 = 1.0;
      local_3f4 = local_8;
      if ((float)local_338 < 1.0) {
        local_3f4 = local_4;
      }
      local_20 = 0.0;
      local_1c = local_3f4;
      local_3f8 = local_20;
      if (0.0 <= local_3f4) {
        local_3f8 = local_3f4;
      }
      fwrite_uchar((uchar)((uint)local_3f8 >> 0x18),in_stack_fffffffffffffbf8);
      local_320 = local_320 + 1;
    }
  }
  std::fstream::~fstream(local_300);
  return;
}

Assistant:

void storeTga(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    fwrite_uchar(0x00, file);
    fwrite_uchar(0x00, file);
    fwrite_uchar(0x02, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_uchar(0x00, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort((unsigned short)img->width , file);
    fwrite_ushort((unsigned short)img->height, file);
    fwrite_uchar(0x18, file);
    fwrite_uchar(0x20, file);

    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        Color c = img->get(x,y);
        fwrite_uchar((unsigned char)(clamp(c.b)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.g)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.r)*255.0f), file);
      }
    }
  }